

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void google::protobuf::compiler::CodeGeneratorResponse_File::SharedDtor(MessageLite *self)

{
  GeneratedCodeInfo *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  CodeGeneratorResponse_File *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (CodeGeneratorResponse_File *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[1]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 2));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[2]._internal_metadata_);
    this = (GeneratedCodeInfo *)local_18[3]._vptr_MessageLite;
    if (this != (GeneratedCodeInfo *)0x0) {
      GeneratedCodeInfo::~GeneratedCodeInfo(this);
      operator_delete(this,0x30);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
             ,0x46b,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void CodeGeneratorResponse_File::SharedDtor(MessageLite& self) {
  CodeGeneratorResponse_File& this_ = static_cast<CodeGeneratorResponse_File&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.insertion_point_.Destroy();
  this_._impl_.content_.Destroy();
  delete this_._impl_.generated_code_info_;
  this_._impl_.~Impl_();
}